

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_ManyUnknownModifiers::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  int iVar3;
  Template *pTVar4;
  Template *this;
  char *pcVar5;
  long lVar6;
  undefined1 local_188 [32];
  Template *local_168;
  string expected_out;
  string tpl_str2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  TemplateDictionary dict;
  TemplateString local_90;
  TemplateString local_70;
  string tpl_str1;
  
  std::__cxx11::string::string
            ((string *)&tpl_str1,"{{from_name:x-test=4}} sent you a message",(allocator *)&dict);
  _dict = tpl_str1._M_dataplus._M_p;
  pTVar4 = (Template *)ctemplate::Template::StringToTemplate((TemplateString *)&dict,DO_NOT_STRIP);
  std::__cxx11::string::string
            ((string *)&tpl_str2,"{{from_name:x-test=4}} sent you a message:",(allocator *)&dict);
  local_168 = pTVar4;
  std::__cxx11::string::string((string *)&expected_out,"me sent you a message:",(allocator *)&dict);
  for (lVar6 = 0; lVar6 != 0x457; lVar6 = lVar6 + 1) {
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_120,(char)lVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   "{{from_name:x-",&local_120);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dict,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   "=4}}");
    std::__cxx11::string::append((string *)&tpl_str2);
    std::__cxx11::string::~string((string *)&dict);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::append((char *)&expected_out);
  }
  _dict = tpl_str2._M_dataplus._M_p;
  this = (Template *)ctemplate::Template::StringToTemplate((TemplateString *)&dict,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString((TemplateString *)local_188,"test");
  pTVar4 = local_168;
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)local_188,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_70,"from_name");
  ctemplate::TemplateString::TemplateString(&local_90,"me");
  TVar1.length_ = local_70.length_;
  TVar1.ptr_ = local_70.ptr_;
  TVar1.is_immutable_ = local_70.is_immutable_;
  TVar1._17_7_ = local_70._17_7_;
  TVar1.id_ = local_70.id_;
  TVar2.length_ = local_90.length_;
  TVar2.ptr_ = local_90.ptr_;
  TVar2.is_immutable_ = local_90.is_immutable_;
  TVar2._17_7_ = local_90._17_7_;
  TVar2.id_ = local_90.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar2);
  local_188._0_8_ = local_188 + 0x10;
  local_188._8_8_ = 0;
  local_188[0x10] = '\0';
  ctemplate::Template::Expand(pTVar4,(string *)local_188,(TemplateDictionaryInterface *)&dict);
  iVar3 = strcmp("me sent you a message",(char *)local_188._0_8_);
  if (iVar3 == 0) {
    (**(code **)(*(long *)pTVar4 + 8))(pTVar4);
    local_188._8_8_ = 0;
    *(char *)local_188._0_8_ = '\0';
    ctemplate::Template::Expand(this,(string *)local_188,(TemplateDictionaryInterface *)&dict);
    iVar3 = strcmp(expected_out._M_dataplus._M_p,(char *)local_188._0_8_);
    if (iVar3 == 0) {
      (**(code **)(*(long *)this + 8))(this);
      std::__cxx11::string::~string((string *)local_188);
      ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
      std::__cxx11::string::~string((string *)&expected_out);
      std::__cxx11::string::~string((string *)&tpl_str2);
      std::__cxx11::string::~string((string *)&tpl_str1);
      return;
    }
    pcVar5 = "strcmp(expected_out.c_str(), out.c_str()) == 0";
  }
  else {
    pcVar5 = "strcmp(\"me sent you a message\", out.c_str()) == 0";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar5);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, ManyUnknownModifiers) {
  string tpl_str1 = "{{from_name:x-test=4}} sent you a message";
  const GOOGLE_NAMESPACE::Template* tpl1 = GOOGLE_NAMESPACE::Template::StringToTemplate(
      tpl_str1, GOOGLE_NAMESPACE::DO_NOT_STRIP);

  string tpl_str2 = "{{from_name:x-test=4}} sent you a message:";
  string expected_out = "me sent you a message:";
  // All those new unknown varnames should cause g_unknown_modifiers
  // to resize.  1111 is an arbitrary large number.
  for (int i = 0; i < 1111; i++) {
    tpl_str2.append("{{from_name:x-" + string(i, 't') + "=4}}");
    expected_out.append("me");
  }
  const GOOGLE_NAMESPACE::Template* tpl2 = GOOGLE_NAMESPACE::Template::StringToTemplate(
      tpl_str2, GOOGLE_NAMESPACE::DO_NOT_STRIP);

  // Even after the resizing, the references to the unknown
  // modifiers in tpl1 and tpl2 should still be valid.
  GOOGLE_NAMESPACE::TemplateDictionary dict("test");
  dict.SetValue("from_name", "me");
  string out;

  out.clear();
  tpl1->Expand(&out, &dict);
  EXPECT_STREQ("me sent you a message", out.c_str());
  delete tpl1;

  out.clear();
  tpl2->Expand(&out, &dict);
  EXPECT_STREQ(expected_out.c_str(), out.c_str());
  delete tpl2;
}